

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitester.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  uint __line;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  FILE *__stream;
  size_t sVar7;
  ssize_t sVar8;
  size_type sVar9;
  long lVar10;
  char *__function;
  char *__assertion;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  char buf [4096];
  string jdata;
  string filename;
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string odata;
  string s;
  string prefix;
  
  buf[0x148] = '\0';
  buf[0x149] = '\0';
  buf[0x14a] = '\0';
  buf[0x14b] = '\0';
  buf[0x14c] = '\0';
  buf[0x14d] = '\0';
  buf[0x14e] = '\0';
  buf[0x14f] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar10 = 0;
  do {
    if (lVar10 == 0x1b0) {
      unescape_unicode_test();
      no_nul_test();
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return 0;
      }
      __stack_chk_fail();
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&basename,*(char **)((long)filenames + lVar10),(allocator<char> *)buf);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                   &srcdir_abi_cxx11_,"/");
    std::operator+(&filename,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                   &basename);
    std::__cxx11::string::~string((string *)buf);
    __stream = fopen(filename._M_dataplus._M_p,"r");
    if (__stream == (FILE *)0x0) {
      __assertion = "f != nullptr";
      __function = "void runtest_file(const char *)";
      __line = 0x34;
LAB_00103f90:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                    ,__line,__function);
    }
    jdata._M_dataplus._M_p = (pointer)&jdata.field_2;
    jdata._M_string_length = 0;
    jdata.field_2._M_local_buf[0] = '\0';
    while( true ) {
      iVar6 = feof(__stream);
      if (iVar6 != 0) break;
      sVar7 = fread((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,1,
                    0x1000,__stream);
      iVar6 = ferror(__stream);
      if (iVar6 != 0) {
        __assertion = "!ferror(f)";
        __function = "void runtest_file(const char *)";
        __line = 0x3b;
        goto LAB_00103f90;
      }
      s._M_dataplus._M_p = (pointer)&s.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&s,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                 buf + (int)sVar7);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&jdata,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
      std::__cxx11::string::~string((string *)&s);
    }
    iVar6 = ferror(__stream);
    if (iVar6 != 0) {
      __assertion = "!ferror(f)";
      __function = "void runtest_file(const char *)";
      __line = 0x41;
      goto LAB_00103f90;
    }
    fclose(__stream);
    std::__cxx11::string::string((string *)&local_1198,&basename);
    sVar7 = 4;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&prefix,&local_1198,0,4);
    bVar2 = std::operator==(&prefix,"pass");
    bVar3 = true;
    if (!bVar2) {
      bVar3 = std::operator==(&prefix,"roun");
    }
    bVar2 = std::operator==(&prefix,"fail");
    bVar4 = std::operator==(&prefix,"roun");
    if ((bVar3 == false) && (!bVar2)) {
      __assertion = "wantPass || wantFail";
      __function = "void runtest(std::string, const std::string &)";
      __line = 0x1e;
      goto LAB_00103f90;
    }
    s._M_string_length = (long)&s.field_2 + 8;
    s.field_2._M_allocated_capacity = 0;
    s.field_2._M_local_buf[8] = '\0';
    s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
    sVar8 = UniValue::read((UniValue *)&s,(int)jdata._M_string_length,jdata._M_dataplus._M_p,sVar7);
    if (bVar3 == false) {
      if ((char)sVar8 != '\0') {
        __assertion = "testResult == false";
        __function = "void runtest(std::string, const std::string &)";
        __line = 0x26;
        goto LAB_00103f90;
      }
    }
    else if ((char)sVar8 == '\0') {
      __assertion = "testResult == true";
      __function = "void runtest(std::string, const std::string &)";
      __line = 0x24;
      goto LAB_00103f90;
    }
    if (bVar4) {
      UniValue::write_abi_cxx11_((UniValue *)&odata,(int)(UniValue *)&s,(void *)0x0,0);
      std::__cxx11::string::string((string *)&local_110,&jdata);
      sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_last_not_of(&local_110," \n\r\t",0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_110,sVar9 + 1,0xffffffffffffffff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == &local_110.field_2) {
        local_f0.field_2._8_8_ = local_110.field_2._8_8_;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0._M_dataplus._M_p = local_110._M_dataplus._M_p;
      }
      local_f0.field_2._M_allocated_capacity._1_7_ = local_110.field_2._M_allocated_capacity._1_7_;
      local_f0.field_2._M_local_buf[0] = local_110.field_2._M_local_buf[0];
      local_f0._M_string_length = local_110._M_string_length;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      _Var5 = std::operator==(&odata,&local_f0);
      if (!_Var5) {
        __assertion = "odata == rtrim(jdata)";
        __function = "void runtest(std::string, const std::string &)";
        __line = 0x2b;
        goto LAB_00103f90;
      }
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&odata);
    }
    UniValue::~UniValue((UniValue *)&s);
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::~string((string *)&local_1198);
    std::__cxx11::string::~string((string *)&jdata);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&basename);
    lVar10 = lVar10 + 8;
  } while( true );
}

Assistant:

int main (int argc, char *argv[])
{
    for (const auto& f: filenames) {
        runtest_file(f);
    }

    unescape_unicode_test();
    no_nul_test();

    return 0;
}